

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilClearTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::DepthStencilClearTests::init
          (DepthStencilClearTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"depth",glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x200000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"depth_scissored",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x10001;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x1000000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"depth_scissored_masked",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1010001;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x1000000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"stencil",glcts::fixed_sample_locations_values + 1
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x100;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x200000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"stencil_masked",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1000100;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x800000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"stencil_scissored",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x10100;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x1000000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"stencil_scissored_masked",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1010100;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x1000000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"depth_stencil",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x101;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x200000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"depth_stencil_masked",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1000101;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x800000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"depth_stencil_scissored",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x10101;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x1000000004;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"depth_stencil_scissored_masked",
             glcts::fixed_sample_locations_values + 1);
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__DepthStencilClearCase_0218ee18;
  pTVar2[1].m_testCtx = (TestContext *)0x401010101;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x10;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void DepthStencilClearTests::init (void)
{
	//																					iters	clears	depth	stencil	scissor	masked
	addChild(new DepthStencilClearCase(m_context, "depth",							"",	4,		2,		true,	false,	false,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_scissored",				"",	4,		16,		true,	false,	true,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_scissored_masked",			"",	4,		16,		true,	false,	true,	true));

	addChild(new DepthStencilClearCase(m_context, "stencil",						"",	4,		2,		false,	true,	false,	false));
	addChild(new DepthStencilClearCase(m_context, "stencil_masked",					"",	4,		8,		false,	true,	false,	true));
	addChild(new DepthStencilClearCase(m_context, "stencil_scissored",				"",	4,		16,		false,	true,	true,	false));
	addChild(new DepthStencilClearCase(m_context, "stencil_scissored_masked",		"",	4,		16,		false,	true,	true,	true));

	addChild(new DepthStencilClearCase(m_context, "depth_stencil",					"",	4,		2,		true,	true,	false,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_stencil_masked",			"",	4,		8,		true,	true,	false,	true));
	addChild(new DepthStencilClearCase(m_context, "depth_stencil_scissored",		"",	4,		16,		true,	true,	true,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_stencil_scissored_masked",	"",	4,		16,		true,	true,	true,	true));
}